

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbinaryast.cpp
# Opt level: O2

SwitchStatement * __thiscall SQASTReader::readSwitchStatement(SQASTReader *this)

{
  Expr *pEVar1;
  SwitchStatement *this_00;
  uint64_t uVar2;
  Statement *pSVar3;
  bool bVar4;
  
  pEVar1 = readExpression(this);
  this_00 = newNode<SQCompilation::SwitchStatement,Arena*,SQCompilation::Expr*>
                      (this,this->astArena,pEVar1);
  uVar2 = InputStream::readVaruint(this->stream);
  ArenaVector<SQCompilation::SwitchCase>::resize(&this_00->_cases,(size_type_conflict)uVar2);
  while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
    pEVar1 = readExpression(this);
    pSVar3 = readStatement(this);
    SQCompilation::SwitchStatement::addCases(this_00,pEVar1,pSVar3);
  }
  pSVar3 = readNullableStatement(this);
  (this_00->_defaultCase).stmt = pSVar3;
  return this_00;
}

Assistant:

SwitchStatement *SQASTReader::readSwitchStatement() {
  Expr *expr = readExpression();

  SwitchStatement *swtch = newNode<SwitchStatement>(astArena, (Expr *)expr);

  size_t size = stream->readUInt64();

  swtch->cases().resize(size);

  for (size_t i = 0; i < size; ++i) {
    Expr *v = readExpression();
    Statement *s = readStatement();

    swtch->addCases(v, s);
  }

  swtch->addDefault(readNullableStatement());

  return swtch;
}